

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O3

BIO_METHOD * kj::TlsConnection::makeBioVtable(void)

{
  BIO_METHOD *pBVar1;
  
  pBVar1 = (BIO_METHOD *)BIO_meth_new(0x400,"KJ stream");
  BIO_meth_set_write(pBVar1,bioWrite);
  BIO_meth_set_read(pBVar1,bioRead);
  BIO_meth_set_ctrl(pBVar1,bioCtrl);
  BIO_meth_set_create(pBVar1,bioCreate);
  BIO_meth_set_destroy(pBVar1,bioDestroy);
  return pBVar1;
}

Assistant:

static const BIO_METHOD* makeBioVtable() {
    BIO_METHOD* vtable = BIO_meth_new(BIO_TYPE_SOURCE_SINK, "KJ stream");
    BIO_meth_set_write(vtable, TlsConnection::bioWrite);
    BIO_meth_set_read(vtable, TlsConnection::bioRead);
    BIO_meth_set_ctrl(vtable, TlsConnection::bioCtrl);
    BIO_meth_set_create(vtable, TlsConnection::bioCreate);
    BIO_meth_set_destroy(vtable, TlsConnection::bioDestroy);
    return vtable;
  }